

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O2

int __thiscall
ncnn::Split::forward
          (Split *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *param_3)

{
  Mat *m;
  pointer pMVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  lVar3 = 0;
  for (uVar2 = 0;
      pMVar1 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar2 < (ulong)(((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)pMVar1) / 0x48);
      uVar2 = uVar2 + 1) {
    Mat::operator=((Mat *)((long)&pMVar1->data + lVar3),m);
    lVar3 = lVar3 + 0x48;
  }
  return 0;
}

Assistant:

int Split::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& /*opt*/) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    for (size_t i = 0; i < top_blobs.size(); i++)
    {
        top_blobs[i] = bottom_blob;
    }

    return 0;
}